

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nim.h
# Opt level: O3

vector<int,_std::allocator<int>_> * __thiscall
NimState::get_moves(vector<int,_std::allocator<int>_> *__return_storage_ptr__,NimState *this)

{
  iterator __position;
  bool bVar1;
  int iVar2;
  int local_24;
  
  check_invariant(this);
  (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_24 = 1;
  if (0 < this->chips) {
    do {
      __position._M_current =
           (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
           super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                  ((vector<int,std::allocator<int>> *)__return_storage_ptr__,__position,&local_24);
      }
      else {
        *__position._M_current = local_24;
        (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
        super__Vector_impl_data._M_finish = __position._M_current + 1;
      }
      iVar2 = this->chips;
      if (2 < iVar2) {
        iVar2 = 3;
      }
      bVar1 = local_24 < iVar2;
      local_24 = local_24 + 1;
    } while (bVar1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<Move> get_moves() const
	{
		check_invariant();

		std::vector<Move> moves;
		for (Move move = 1; move <= std::min(3, chips); ++move) {
			moves.push_back(move);
		}
		return moves;
	}